

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResult
          (TransformFeedbackOverflowQueryFunctionalBase *this,GLuint query,GLboolean expected)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *pCVar6;
  undefined4 local_38;
  uint local_34;
  GLuint initValue;
  GLuint check_result;
  GLuint checker_query;
  GLuint current_program;
  GLuint actual;
  bool result;
  Functions *gl;
  GLboolean expected_local;
  TransformFeedbackOverflowQueryFunctionalBase *pTStack_10;
  GLuint query_local;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  gl._3_1_ = expected;
  gl._4_4_ = query;
  pTStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _actual = CONCAT44(extraout_var,iVar3);
  current_program._3_1_ = 1;
  pCVar6 = deqp::Context::getContextInfo
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  check_result = (*pCVar6->_vptr_ContextInfo[2])(pCVar6,0x8b8d);
  (**(code **)(_actual + 0x6e0))(1,&initValue);
  pcVar1 = *(code **)(_actual + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram(this->m_checker_program);
  (*pcVar1)(dVar4);
  (**(code **)(_actual + 0x18))(gl._4_4_,0x8e13);
  (**(code **)(_actual + 0x20))(0x8c87,initValue);
  (**(code **)(_actual + 0x538))(0,0,1);
  (**(code **)(_actual + 0x628))(0x8c87);
  (**(code **)(_actual + 0x620))();
  (**(code **)(_actual + 0xa20))(initValue,0x8866,&local_34);
  if (local_34 != gl._3_1_) {
    current_program._3_1_ = 0;
  }
  bVar2 = TransformFeedbackOverflowQueryBaseTest::supportsConditionalRenderInverted
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar2) {
    (**(code **)(_actual + 0x18))(gl._4_4_,0x8e17);
    (**(code **)(_actual + 0x20))(0x8c87,initValue);
    (**(code **)(_actual + 0x538))(0,0,1);
    (**(code **)(_actual + 0x628))(0x8c87);
    (**(code **)(_actual + 0x620))();
    (**(code **)(_actual + 0xa20))(initValue,0x8866,&local_34);
    if (local_34 == gl._3_1_) {
      current_program._3_1_ = 0;
    }
  }
  (**(code **)(_actual + 0x1680))(check_result);
  (**(code **)(_actual + 0xa20))(gl._4_4_,0x8866,&checker_query);
  if ((checker_query & 0xff) != (uint)gl._3_1_) {
    current_program._3_1_ = 0;
  }
  bVar2 = TransformFeedbackOverflowQueryBaseTest::supportsQueryBufferObject
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar2) {
    local_38 = 0xdeadbeef;
    (**(code **)(_actual + 0x6c8))(1,&this->m_query_buffer);
    (**(code **)(_actual + 0x40))(0x9192,this->m_query_buffer);
    (**(code **)(_actual + 0x150))(0x9192,4,&local_38,0x88e1);
    (**(code **)(_actual + 0xa20))(gl._4_4_,0x8866,0);
    (**(code **)(_actual + 0x7b8))(0x9192,0,4,&checker_query);
    (**(code **)(_actual + 0x438))(1,&this->m_query_buffer);
    if ((checker_query & 0xff) != (uint)gl._3_1_) {
      current_program._3_1_ = 0;
    }
  }
  (**(code **)(_actual + 0x458))(1,&initValue);
  return (bool)(current_program._3_1_ & 1);
}

Assistant:

bool verifyQueryResult(GLuint query, GLboolean expected)
	{
		const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
		bool				  result = true;
		GLuint				  actual;

		GLuint current_program = m_context.getContextInfo().getInt(GL_CURRENT_PROGRAM);
		GLuint checker_query, check_result;

		// We'll use a PRIMITIVES_GENERATED query to test whether conditional
		// rendering actually executed the draw command or not. If the draw command
		// was discarded then the PRIMITIVES_GENERATED query should have a result
		// of zero.
		gl.genQueries(1, &checker_query);

		gl.useProgram(m_checker_program->getProgram());

		// Verify that conditional render discards the rendering if the expected
		// result is FALSE and renders otherwise.
		gl.beginConditionalRender(query, GL_QUERY_WAIT);
		gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
		gl.drawArrays(GL_POINTS, 0, 1);
		gl.endQuery(GL_PRIMITIVES_GENERATED);
		gl.endConditionalRender();
		gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
		if (check_result != (GLuint)expected)
		{
			result = false;
		}

		// Verify that an inverted conditional render discards the rendering if
		// the expected result is TRUE and renders otherwise.
		if (supportsConditionalRenderInverted())
		{
			gl.beginConditionalRender(query, GL_QUERY_WAIT_INVERTED);
			gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
			gl.drawArrays(GL_POINTS, 0, 1);
			gl.endQuery(GL_PRIMITIVES_GENERATED);
			gl.endConditionalRender();
			gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
			if (check_result == (GLuint)expected)
			{
				result = false;
			}
		}

		gl.useProgram(current_program);

		// Verify that the result of the query matches the expected result.
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &actual);
		if ((GLboolean)actual != expected)
		{
			result = false;
		}

		// Verify that the result of the query matches the expected result even
		// when using a query buffer.
		if (supportsQueryBufferObject())
		{
			const GLuint initValue = 0xDEADBEEF;

			gl.genBuffers(1, &m_query_buffer);
			gl.bindBuffer(GL_QUERY_BUFFER, m_query_buffer);
			gl.bufferData(GL_QUERY_BUFFER, sizeof(initValue), &initValue, GL_STREAM_READ);
			gl.getQueryObjectuiv(query, GL_QUERY_RESULT, NULL);
			gl.getBufferSubData(GL_QUERY_BUFFER, 0, sizeof(actual), &actual);
			gl.deleteBuffers(1, &m_query_buffer);

			if ((GLboolean)actual != expected)
			{
				result = false;
			}
		}

		gl.deleteQueries(1, &checker_query);

		return result;
	}